

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autobuf.c
# Opt level: O3

void abuf_pull(autobuf *autobuf,size_t len)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  size_t __n;
  ulong __size;
  size_t sVar4;
  
  if (len != 0 && autobuf != (autobuf *)0x0) {
    __n = autobuf->_len - len;
    sVar4 = len;
    if (__n != 0) {
      memmove(autobuf->_buf,autobuf->_buf + len,__n);
      sVar4 = autobuf->_len;
    }
    autobuf->_len = sVar4 - len;
    iVar1 = getpagesize();
    uVar2 = (ulong)iVar1;
    if ((sVar4 - len) + uVar2 <= autobuf->_total) {
      __size = autobuf->_total - uVar2;
      autobuf->_total = __size;
      if (__size <= uVar2) {
        __size = uVar2;
      }
      pcVar3 = (char *)realloc(autobuf->_buf,__size);
      if (pcVar3 != (char *)0x0) {
        autobuf->_buf = pcVar3;
        autobuf->_total = __size;
      }
    }
  }
  return;
}

Assistant:

void
abuf_pull(struct autobuf *autobuf, size_t len) {
  char *p;
  size_t newsize;

  if (autobuf == NULL || len == 0)
    return;

  if (len != autobuf->_len) {
    memmove(autobuf->_buf, &autobuf->_buf[len], autobuf->_len - len);
  }
  autobuf->_len -= len;

  if (autobuf->_len + getpagesize() > autobuf->_total) {
    /* only reduce buffer size if difference is larger than a chunk */
    return;
  }
  newsize = autobuf->_total -= getpagesize();
  if (newsize < (size_t)getpagesize()) {
    newsize = getpagesize();
  }

  /* generate smaller buffer */
  p = realloc(autobuf->_buf, newsize);
  if (p == NULL) {
    /* keep the longer buffer if we cannot get a smaller one */
    return;
  }
  autobuf->_buf = p;
  autobuf->_total = newsize;
  return;
}